

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

BuiltinDecl *
jsonnet::internal::jsonnet_builtin_decl(BuiltinDecl *__return_storage_ptr__,unsigned_long builtin)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_24;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_25;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_26;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_27;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_28;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_29;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_30;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_31;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_32;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_33;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_34;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_35;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_36;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_37;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_38;
  initializer_list<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  __l_39;
  allocator_type local_89;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_88;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  switch(builtin) {
  case 0:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"makeArray",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"sz",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"func",L"");
    __l._M_len = 2;
    __l._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 1:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"pow",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"n",L"");
    __l_19._M_len = 2;
    __l_19._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_19,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 2:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"floor",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_15._M_len = 1;
    __l_15._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_15,&local_89);
    break;
  case 3:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"ceil",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_17._M_len = 1;
    __l_17._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_17,&local_89);
    break;
  case 4:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"sqrt",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_09._M_len = 1;
    __l_09._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_09,&local_89);
    break;
  case 5:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"sin",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_23._M_len = 1;
    __l_23._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_23,&local_89);
    break;
  case 6:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"cos",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_26._M_len = 1;
    __l_26._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_26,&local_89);
    break;
  case 7:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"tan",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_18._M_len = 1;
    __l_18._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_18,&local_89);
    break;
  case 8:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"asin",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_29._M_len = 1;
    __l_29._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_29,&local_89);
    break;
  case 9:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"acos",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_12._M_len = 1;
    __l_12._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_12,&local_89);
    break;
  case 10:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"atan",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_28._M_len = 1;
    __l_28._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_28,&local_89);
    break;
  case 0xb:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"type",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_08._M_len = 1;
    __l_08._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_08,&local_89);
    break;
  case 0xc:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"filter",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"func",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"arr",L"");
    __l_11._M_len = 2;
    __l_11._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_11,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0xd:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"objectHasEx",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"obj",L"");
    local_68[0] = local_58;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"f",L"");
    plVar2 = local_38;
    local_48[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_48,L"inc_hidden",L"");
    __l_25._M_len = 3;
    __l_25._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_25,&local_89);
    lVar3 = -0x60;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0xe:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"length",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_06._M_len = 1;
    __l_06._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_06,&local_89);
    break;
  case 0xf:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"objectFieldsEx",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"obj",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"inc_hidden",L"");
    __l_16._M_len = 2;
    __l_16._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_16,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x10:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"codepoint",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    __l_05._M_len = 1;
    __l_05._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_05,&local_89);
    break;
  case 0x11:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"char",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"n",L"");
    __l_21._M_len = 1;
    __l_21._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_21,&local_89);
    break;
  case 0x12:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"log",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"n",L"");
    __l_27._M_len = 1;
    __l_27._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_27,&local_89);
    break;
  case 0x13:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"exp",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"n",L"");
    __l_34._M_len = 1;
    __l_34._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_34,&local_89);
    break;
  case 0x14:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"mantissa",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"n",L"");
    __l_22._M_len = 1;
    __l_22._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_22,&local_89);
    break;
  case 0x15:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"exponent",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"n",L"");
    __l_24._M_len = 1;
    __l_24._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_24,&local_89);
    break;
  case 0x16:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"modulo",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"a",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"b",L"");
    __l_32._M_len = 2;
    __l_32._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_32,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x17:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"extVar",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"x",L"");
    __l_35._M_len = 1;
    __l_35._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_35,&local_89);
    break;
  case 0x18:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"primitiveEquals",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"a",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"b",L"");
    __l_14._M_len = 2;
    __l_14._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_14,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x19:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"native",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"name",L"");
    __l_13._M_len = 1;
    __l_13._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_13,&local_89);
    break;
  case 0x1a:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"md5",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    __l_39._M_len = 1;
    __l_39._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_39,&local_89);
    break;
  case 0x1b:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"trace",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"rest",L"");
    __l_03._M_len = 2;
    __l_03._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_03,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x1c:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"splitLimit",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    local_68[0] = local_58;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"c",L"");
    plVar2 = local_38;
    local_48[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_48,L"maxsplits",L"");
    __l_36._M_len = 3;
    __l_36._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_36,&local_89);
    lVar3 = -0x60;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x1d:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"substr",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    local_68[0] = local_58;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"from",L"");
    plVar2 = local_38;
    local_48[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_48,L"len",L"");
    __l_37._M_len = 3;
    __l_37._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_37,&local_89);
    lVar3 = -0x60;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x1e:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"range",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"from",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"to",L"");
    __l_30._M_len = 2;
    __l_30._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_30,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x1f:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"strReplace",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    local_68[0] = local_58;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"from",L"");
    plVar2 = local_38;
    local_48[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_48,L"to",L"");
    __l_20._M_len = 3;
    __l_20._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_20,&local_89);
    lVar3 = -0x60;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x20:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"asciiLower",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    __l_31._M_len = 1;
    __l_31._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_31,&local_89);
    break;
  case 0x21:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"asciiUpper",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    __l_07._M_len = 1;
    __l_07._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_07,&local_89);
    break;
  case 0x22:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"join",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"sep",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"arr",L"");
    __l_04._M_len = 2;
    __l_04._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_04,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x23:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"parseJson",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    __l_01._M_len = 1;
    __l_01._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_01,&local_89);
    break;
  case 0x24:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"parseYaml",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    __l_02._M_len = 1;
    __l_02._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_02,&local_89);
    break;
  case 0x25:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"encodeUTF8",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"str",L"");
    __l_00._M_len = 1;
    __l_00._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_00,&local_89);
    break;
  case 0x26:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"decodeUTF8",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"arr",L"");
    __l_38._M_len = 1;
    __l_38._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_38,&local_89);
    break;
  case 0x27:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"atan2",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"y",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"x",L"");
    __l_33._M_len = 2;
    __l_33._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_33,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  case 0x28:
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)__return_storage_ptr__,L"hypot",L"");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_88,L"a",L"");
    plVar2 = local_58;
    local_68[0] = plVar2;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_68,L"b",L"");
    __l_10._M_len = 2;
    __l_10._M_array = &local_88;
    std::
    vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
    ::vector(&__return_storage_ptr__->params,__l_10,&local_89);
    lVar3 = -0x40;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 * 4 + 4);
      }
      plVar2 = plVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return __return_storage_ptr__;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unrecognized builtin function: "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,builtin);
    std::endl<char,std::char_traits<char>>(poVar1);
    abort();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

BuiltinDecl jsonnet_builtin_decl(unsigned long builtin)
{
    switch (builtin) {
        case 0: return {U"makeArray", {U"sz", U"func"}};
        case 1: return {U"pow", {U"x", U"n"}};
        case 2: return {U"floor", {U"x"}};
        case 3: return {U"ceil", {U"x"}};
        case 4: return {U"sqrt", {U"x"}};
        case 5: return {U"sin", {U"x"}};
        case 6: return {U"cos", {U"x"}};
        case 7: return {U"tan", {U"x"}};
        case 8: return {U"asin", {U"x"}};
        case 9: return {U"acos", {U"x"}};
        case 10: return {U"atan", {U"x"}};
        case 11: return {U"type", {U"x"}};
        case 12: return {U"filter", {U"func", U"arr"}};
        case 13: return {U"objectHasEx", {U"obj", U"f", U"inc_hidden"}};
        case 14: return {U"length", {U"x"}};
        case 15: return {U"objectFieldsEx", {U"obj", U"inc_hidden"}};
        case 16: return {U"codepoint", {U"str"}};
        case 17: return {U"char", {U"n"}};
        case 18: return {U"log", {U"n"}};
        case 19: return {U"exp", {U"n"}};
        case 20: return {U"mantissa", {U"n"}};
        case 21: return {U"exponent", {U"n"}};
        case 22: return {U"modulo", {U"a", U"b"}};
        case 23: return {U"extVar", {U"x"}};
        case 24: return {U"primitiveEquals", {U"a", U"b"}};
        case 25: return {U"native", {U"name"}};
        case 26: return {U"md5", {U"str"}};
        case 27: return {U"trace", {U"str", U"rest"}};
        case 28: return {U"splitLimit", {U"str", U"c", U"maxsplits"}};
        case 29: return {U"substr", {U"str", U"from", U"len"}};
        case 30: return {U"range", {U"from", U"to"}};
        case 31: return {U"strReplace", {U"str", U"from", U"to"}};
        case 32: return {U"asciiLower", {U"str"}};
        case 33: return {U"asciiUpper", {U"str"}};
        case 34: return {U"join", {U"sep", U"arr"}};
        case 35: return {U"parseJson", {U"str"}};
        case 36: return {U"parseYaml", {U"str"}};
        case 37: return {U"encodeUTF8", {U"str"}};
        case 38: return {U"decodeUTF8", {U"arr"}};
        case 39: return {U"atan2", {U"y", U"x"}};
        case 40: return {U"hypot", {U"a", U"b"}};
        default:
            std::cerr << "INTERNAL ERROR: Unrecognized builtin function: " << builtin << std::endl;
            std::abort();
    }
    // Quiet, compiler.
    return BuiltinDecl();
}